

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O1

void __thiscall rudp::session::send_packet(session *this,buffer_ptr_t *data,send_cb_t *cb)

{
  implementation_type *impl;
  socket_type sVar1;
  socket *psVar2;
  element_type *peVar3;
  service_type *psVar4;
  error_category *peVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined3 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:503:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  undefined8 uVar11;
  long in_FS_OFFSET;
  ptr local_98;
  stored_size_type local_80;
  undefined1 local_78 [8];
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Any_data local_50;
  code *local_40;
  
  psVar2 = this->socket;
  peVar3 = (data->
           super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_80 = (peVar3->
             super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
             ).m_holder.m_size;
  local_78 = (undefined1  [8])this;
  std::__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rudp::session,void>
            ((__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             (__weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_60 = (data->
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  local_58 = (data->
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  std::function<void_(bool)>::function((function<void_(bool)> *)&local_50,cb);
  psVar4 = (psVar2->
           super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           ).impl_.service_;
  local_98.h = (anon_class_72_4_ff401564 *)local_78;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  op = (reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:503:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::detail::thread_info_base::
          allocate<boost::asio::detail::thread_info_base::default_tag>(uVar11,0xe8);
  p_Var10 = local_68;
  impl = &(psVar2->
          super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ).impl_.implementation_;
  local_98.p = (reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:503:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  sVar1 = (impl->super_base_implementation_type).socket_;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.super_operation.func_ =
       boost::asio::detail::
       reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:503:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.super_operation.task_result_ = 0;
  bVar8 = (psVar4->super_reactive_socket_service_base).success_ec_.failed_;
  uVar9 = *(undefined3 *)&(psVar4->super_reactive_socket_service_base).success_ec_.field_0x5;
  peVar5 = (psVar4->super_reactive_socket_service_base).success_ec_.cat_;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.ec_.val_ = (psVar4->super_reactive_socket_service_base).success_ec_.val_;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.ec_.failed_ = bVar8;
  *(undefined3 *)
   &(op->
    super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
    ).super_reactor_op.ec_.field_0x5 = uVar9;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.ec_.cat_ = peVar5;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.bytes_transferred_ = 0;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).super_reactor_op.perform_func_ =
       boost::asio::detail::
       reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
       ::do_perform;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).socket_ = sVar1;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.data_ = peVar3;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).buffers_.super_mutable_buffer.size_ = local_80;
  uVar11 = *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 8);
  uVar6 = *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 0xc);
  uVar7 = *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 0x14);
  *(undefined8 *)
   &(op->
    super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
    ).destination_.impl_.data_ = *(undefined8 *)&(this->endpoint).impl_.data_;
  *(undefined8 *)
   ((long)&(op->
           super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
           ).destination_.impl_.data_ + 8) = uVar11;
  *(undefined8 *)
   ((long)&(op->
           super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
           ).destination_.impl_.data_ + 0xc) = uVar6;
  *(undefined8 *)
   ((long)&(op->
           super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
           ).destination_.impl_.data_ + 0x14) = uVar7;
  (op->
  super_reactive_socket_sendto_op_base<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
  ).flags_ = 0;
  (op->handler_).this = (session *)local_78;
  (op->handler_).this_.super___shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_70;
  (op->handler_).this_.super___shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (op->handler_).this_.super___shared_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var10;
  local_70 = (element_type *)0x0;
  (op->handler_).data.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_60;
  (op->handler_).data.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_58;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  local_98.v = op;
  std::function<void_(bool)>::function(&(op->handler_).cb,(function<void_(bool)> *)&local_50);
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&(psVar2->
                        super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        ).impl_.executor_);
  local_98.p = op;
  boost::asio::detail::reactive_socket_service_base::start_op
            (&psVar4->super_reactive_socket_service_base,&impl->super_base_implementation_type,1,
             (reactor_op *)op,false,true,false);
  local_98.v = (reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:503:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  local_98.p = (reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_Fadis[P]rudp_src_rudp_cpp:503:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  boost::asio::detail::
  reactive_socket_sendto_op<boost::asio::mutable_buffers_1,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:503:7),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset(&local_98);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  return;
}

Assistant:

void session::send_packet(
    const buffer_ptr_t &data,
    const send_cb_t &cb
  ) {
    socket.async_send_to( boost::asio::buffer( data->data(), data->size() ),
      endpoint,
      [this,this_=shared_from_this(),data,cb]( const boost::system::error_code &error, size_t ) {
        if( error ) {
          cb( false );
        }
      }
    );
  }